

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_unziplo_32(c_v128 a,c_v128 b)

{
  c_v128 cVar1;
  
  cVar1._0_8_ = b.u64[0] & 0xffffffff | b.u64[1] << 0x20;
  cVar1._8_8_ = a.u64[0] & 0xffffffff | a.u64[1] << 0x20;
  return cVar1;
}

Assistant:

SIMD_INLINE c_v128 _c_v128_unzip_32(c_v128 a, c_v128 b, int mode) {
  c_v128 t;
  if (mode) {
    t.u32[3] = b.u32[3];
    t.u32[2] = b.u32[1];
    t.u32[1] = a.u32[3];
    t.u32[0] = a.u32[1];
  } else {
    t.u32[3] = a.u32[2];
    t.u32[2] = a.u32[0];
    t.u32[1] = b.u32[2];
    t.u32[0] = b.u32[0];
  }
  return t;
}